

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitConst(I64ToI32Lowering *this,Const *curr)

{
  Builder *this_00;
  Const *append;
  Const *value;
  LocalSet *any;
  Block *expression;
  Block *local_58;
  undefined1 local_50 [8];
  TempVar highBits;
  
  if (((this->
       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
       ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
       currFunction == (Function *)0x0) ||
     ((curr->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id != 3)) {
    return;
  }
  getTemp((TempVar *)local_50,this,(Type)0x2);
  if ((curr->value).type.id == 3) {
    append = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                        (curr->value).field_0.i32);
    if ((char)highBits.pass == '\x01') {
      __assert_fail("!moved",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
    }
    if ((curr->value).type.id == 3) {
      this_00 = (this->builder)._M_t.
                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      value = Builder::makeConst<int>(this_00,*(int *)((long)&(curr->value).field_0 + 4));
      any = Builder::makeLocalSet(this_00,local_50._0_4_,(Expression *)value);
      expression = Builder::blockify((this->builder)._M_t.
                                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                     .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                                     (Expression *)any,(Expression *)append);
      local_58 = expression;
      std::
      _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->highBitVars,&local_58,local_50);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      TempVar::~TempVar((TempVar *)local_50);
      return;
    }
  }
  __assert_fail("type == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x129,"int64_t wasm::Literal::geti64() const");
}

Assistant:

void visitConst(Const* curr) {
    if (!getFunction()) {
      return; // if in a global init, skip - we already handled that.
    }
    if (curr->type != Type::i64) {
      return;
    }
    TempVar highBits = getTemp();
    Const* lowVal =
      builder->makeConst(int32_t(curr->value.geti64() & 0xffffffff));
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeConst(int32_t(uint64_t(curr->value.geti64()) >> 32)));
    Block* result = builder->blockify(setHigh, lowVal);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }